

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O3

CP_MAPPING * CODEPAGEGetData(UINT CodePage)

{
  CP_MAPPING *pCVar1;
  
  pCVar1 = (CP_MAPPING *)0x0;
  if (CodePage == 0xfde9) {
    pCVar1 = CP_TO_NATIVE_TABLE;
  }
  if (CodePage == 0) {
    pCVar1 = CP_TO_NATIVE_TABLE;
  }
  return pCVar1;
}

Assistant:

const CP_MAPPING *
CODEPAGEGetData( IN UINT CodePage )
{
    UINT nSize = sizeof( CP_TO_NATIVE_TABLE ) / sizeof( CP_TO_NATIVE_TABLE[ 0 ] );
    UINT nIndex = 0;

    if ( CP_ACP == CodePage )
    {
        CodePage = PAL_ACP;
    }

    /* checking if the CodePage is ACP and returning true if so */
    while (nIndex < nSize)
    {
        if ( ( CP_TO_NATIVE_TABLE[ nIndex ] ).nCodePage == CodePage )
        {
            return &(CP_TO_NATIVE_TABLE[ nIndex ]);
        }
        nIndex++;
    }
    return NULL;
}